

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O2

ze_result_t
zeGetVirtualMemProcAddrTable(ze_api_version_t version,ze_virtual_mem_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  ze_pfnVirtualMemReserve_t p_Var3;
  ze_pfnVirtualMemFree_t p_Var4;
  ze_pfnVirtualMemQueryPageSize_t p_Var5;
  ze_pfnVirtualMemMap_t p_Var6;
  ze_pfnVirtualMemSetAccessAttribute_t p_Var7;
  int iVar8;
  ze_result_t zVar9;
  code *pcVar10;
  long lVar11;
  long lVar12;
  long extraout_RDX;
  bool bVar13;
  iterator __begin1;
  undefined8 *puVar14;
  ze_virtual_mem_dditable_t dditable;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ze_pfnVirtualMemGetAccessAttribute_t local_38;
  
  puVar14 = *(undefined8 **)(loader::context + 0x15e0);
  puVar1 = *(undefined8 **)(loader::context + 0x15e8);
  if (puVar1 != puVar14) {
    if (pDdiTable == (ze_virtual_mem_dditable_t *)0x0) {
      return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    if (*(int *)(loader::context + 0x15c0) < (int)version) {
      return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    }
    bVar13 = false;
    for (; puVar14 != puVar1; puVar14 = puVar14 + 0x1b3) {
      if ((*(int *)(puVar14 + 1) == 0) &&
         (pcVar10 = (code *)dlsym(*puVar14,"zeGetVirtualMemProcAddrTable"), pcVar10 != (code *)0x0))
      {
        iVar8 = (*pcVar10)(version,puVar14 + 0xc0);
        if (iVar8 == 0) {
          bVar13 = true;
        }
        else {
          *(int *)(puVar14 + 1) = iVar8;
        }
      }
    }
    if (bVar13) {
      lVar2 = *(long *)(loader::context + 0x15e0);
      lVar11 = *(long *)(loader::context + 0x15e8) - lVar2;
      lVar12 = lVar11 % 0xd98;
      if (((ulong)(lVar11 / 0xd98) < 2) && (*(char *)(loader::context + 0x1629) != '\x01')) {
        pDdiTable->pfnGetAccessAttribute = *(ze_pfnVirtualMemGetAccessAttribute_t *)(lVar2 + 0x630);
        p_Var3 = *(ze_pfnVirtualMemReserve_t *)(lVar2 + 0x600);
        p_Var4 = *(ze_pfnVirtualMemFree_t *)(lVar2 + 0x608);
        p_Var5 = *(ze_pfnVirtualMemQueryPageSize_t *)(lVar2 + 0x610);
        p_Var6 = *(ze_pfnVirtualMemMap_t *)(lVar2 + 0x618);
        p_Var7 = *(ze_pfnVirtualMemSetAccessAttribute_t *)(lVar2 + 0x628);
        pDdiTable->pfnUnmap = *(ze_pfnVirtualMemUnmap_t *)(lVar2 + 0x620);
        pDdiTable->pfnSetAccessAttribute = p_Var7;
        pDdiTable->pfnQueryPageSize = p_Var5;
        pDdiTable->pfnMap = p_Var6;
        pDdiTable->pfnReserve = p_Var3;
        pDdiTable->pfnFree = p_Var4;
      }
      else {
        pDdiTable->pfnReserve = loader::zeVirtualMemReserve;
        pDdiTable->pfnFree = loader::zeVirtualMemFree;
        pDdiTable->pfnQueryPageSize = loader::zeVirtualMemQueryPageSize;
        pDdiTable->pfnMap = loader::zeVirtualMemMap;
        pDdiTable->pfnUnmap = loader::zeVirtualMemUnmap;
        pDdiTable->pfnSetAccessAttribute = loader::zeVirtualMemSetAccessAttribute;
        pDdiTable->pfnGetAccessAttribute = loader::zeVirtualMemGetAccessAttribute;
      }
      if (*(long *)(loader::context + 0x1618) != 0) {
        pcVar10 = (code *)dlsym(*(long *)(loader::context + 0x1618),"zeGetVirtualMemProcAddrTable",
                                lVar12);
        if (pcVar10 == (code *)0x0) {
          return ZE_RESULT_ERROR_UNINITIALIZED;
        }
        zVar9 = (*pcVar10)(version,pDdiTable);
        lVar12 = extraout_RDX;
        if (zVar9 != ZE_RESULT_SUCCESS) {
          return zVar9;
        }
      }
      if (*(long *)(loader::context + 0x1620) == 0) {
        return ZE_RESULT_SUCCESS;
      }
      pcVar10 = (code *)dlsym(*(long *)(loader::context + 0x1620),"zeGetVirtualMemProcAddrTable",
                              lVar12);
      if (pcVar10 != (code *)0x0) {
        local_38 = pDdiTable->pfnGetAccessAttribute;
        local_68 = *(undefined4 *)&pDdiTable->pfnReserve;
        uStack_64 = *(undefined4 *)((long)&pDdiTable->pfnReserve + 4);
        uStack_60 = *(undefined4 *)&pDdiTable->pfnFree;
        uStack_5c = *(undefined4 *)((long)&pDdiTable->pfnFree + 4);
        local_58 = *(undefined4 *)&pDdiTable->pfnQueryPageSize;
        uStack_54 = *(undefined4 *)((long)&pDdiTable->pfnQueryPageSize + 4);
        uStack_50 = *(undefined4 *)&pDdiTable->pfnMap;
        uStack_4c = *(undefined4 *)((long)&pDdiTable->pfnMap + 4);
        local_48 = *(undefined4 *)&pDdiTable->pfnUnmap;
        uStack_44 = *(undefined4 *)((long)&pDdiTable->pfnUnmap + 4);
        uStack_40 = *(undefined4 *)&pDdiTable->pfnSetAccessAttribute;
        uStack_3c = *(undefined4 *)((long)&pDdiTable->pfnSetAccessAttribute + 4);
        zVar9 = (*pcVar10)(version,&local_68);
        lVar2 = loader::context;
        *(undefined4 *)(loader::context + 0x1c48) = local_68;
        *(undefined4 *)(lVar2 + 0x1c4c) = uStack_64;
        *(undefined4 *)(lVar2 + 0x1c50) = uStack_60;
        *(undefined4 *)(lVar2 + 0x1c54) = uStack_5c;
        *(undefined4 *)(lVar2 + 0x1c58) = local_58;
        *(undefined4 *)(lVar2 + 0x1c5c) = uStack_54;
        *(undefined4 *)(lVar2 + 0x1c60) = uStack_50;
        *(undefined4 *)(lVar2 + 0x1c64) = uStack_4c;
        *(undefined4 *)(lVar2 + 0x1c68) = local_48;
        *(undefined4 *)(lVar2 + 0x1c6c) = uStack_44;
        *(undefined4 *)(lVar2 + 0x1c70) = uStack_40;
        *(undefined4 *)(lVar2 + 0x1c74) = uStack_3c;
        *(ze_pfnVirtualMemGetAccessAttribute_t *)(lVar2 + 0x1c78) = local_38;
        if (*(char *)(lVar2 + 0x1652) == '\x01') {
          zVar9 = (*pcVar10)(version,pDdiTable);
          return zVar9;
        }
        return zVar9;
      }
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetVirtualMemProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_virtual_mem_dditable_t* pDdiTable            ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    bool atLeastOneDriverValid = false;
    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<ze_pfnGetVirtualMemProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zeGetVirtualMemProcAddrTable") );
        if(!getTable) 
            continue; 
        auto getTableResult = getTable( version, &drv.dditable.ze.VirtualMem);
        if(getTableResult == ZE_RESULT_SUCCESS) 
            atLeastOneDriverValid = true;
        else
            drv.initStatus = getTableResult;
    }

    if(!atLeastOneDriverValid)
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    else
        result = ZE_RESULT_SUCCESS;

    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnReserve                                  = loader::zeVirtualMemReserve;
            pDdiTable->pfnFree                                     = loader::zeVirtualMemFree;
            pDdiTable->pfnQueryPageSize                            = loader::zeVirtualMemQueryPageSize;
            pDdiTable->pfnMap                                      = loader::zeVirtualMemMap;
            pDdiTable->pfnUnmap                                    = loader::zeVirtualMemUnmap;
            pDdiTable->pfnSetAccessAttribute                       = loader::zeVirtualMemSetAccessAttribute;
            pDdiTable->pfnGetAccessAttribute                       = loader::zeVirtualMemGetAccessAttribute;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.ze.VirtualMem;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetVirtualMemProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zeGetVirtualMemProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    // If the API tracing layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->tracingLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetVirtualMemProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->tracingLayer, "zeGetVirtualMemProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        ze_virtual_mem_dditable_t dditable;
        memcpy(&dditable, pDdiTable, sizeof(ze_virtual_mem_dditable_t));
        result = getTable( version, &dditable );
        loader::context->tracing_dditable.ze.VirtualMem = dditable;
        if ( loader::context->tracingLayerEnabled ) {
            result = getTable( version, pDdiTable );
        }
    }

    return result;
}